

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

xmlStreamCompPtr xmlNewStreamComp(int size)

{
  xmlStreamStepPtr pxVar1;
  xmlStreamCompPtr cur;
  xmlStreamCompPtr pxStack_10;
  int size_local;
  
  cur._4_4_ = size;
  if (size < 4) {
    cur._4_4_ = 4;
  }
  pxStack_10 = (xmlStreamCompPtr)(*xmlMalloc)(0x20);
  if (pxStack_10 == (xmlStreamCompPtr)0x0) {
    pxStack_10 = (xmlStreamCompPtr)0x0;
  }
  else {
    memset(pxStack_10,0,0x20);
    pxVar1 = (xmlStreamStepPtr)(*xmlMalloc)((long)cur._4_4_ << 5);
    pxStack_10->steps = pxVar1;
    if (pxStack_10->steps == (xmlStreamStepPtr)0x0) {
      (*xmlFree)(pxStack_10);
      pxStack_10 = (xmlStreamCompPtr)0x0;
    }
    else {
      pxStack_10->nbStep = 0;
      pxStack_10->maxStep = cur._4_4_;
    }
  }
  return pxStack_10;
}

Assistant:

static xmlStreamCompPtr
xmlNewStreamComp(int size) {
    xmlStreamCompPtr cur;

    if (size < 4)
        size  = 4;

    cur = (xmlStreamCompPtr) xmlMalloc(sizeof(xmlStreamComp));
    if (cur == NULL) {
	ERROR(NULL, NULL, NULL,
		"xmlNewStreamComp: malloc failed\n");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlStreamComp));
    cur->steps = (xmlStreamStepPtr) xmlMalloc(size * sizeof(xmlStreamStep));
    if (cur->steps == NULL) {
	xmlFree(cur);
	ERROR(NULL, NULL, NULL,
	      "xmlNewStreamComp: malloc failed\n");
	return(NULL);
    }
    cur->nbStep = 0;
    cur->maxStep = size;
    return(cur);
}